

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_primary_expression(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  token *string;
  AST *hold;
  token *hold_token;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  if (translation_data->tokens->size == 0) {
    push_translation_error("expected something here",translation_data);
    translation_data_local = (Translation_Data *)get_error_tree((AST *)0x0);
  }
  else {
    string = (token *)Queue_Pop(translation_data->tokens);
    switch(string->type) {
    case KW_OPEN_NORMAL:
      translation_data_local = (Translation_Data *)parse_expression(translation_data,scope);
      cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
      if (cVar1 == '\0') {
        push_translation_error("expected \')\' here",translation_data);
        translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
      }
      break;
    default:
      push_translation_error("error in expression",translation_data);
      translation_data_local = (Translation_Data *)get_error_tree((AST *)0x0);
      break;
    case KW_HEXADECIMAL_CONSTANT:
    case KW_DECIMAL_CONSTANT:
    case KW_OCTAL_CONSTANT:
    case KW_UNSIGNED_DECIMAL_CONSTANT:
    case KW_UNSIGNED_OCTAL_CONSTANT:
    case KW_UNSIGNED_HEXADECIMAL_CONSTANT:
    case KW_UNSIGNED_LONG_HEXADECIMAL_CONSTANT:
    case KW_UNSIGNED_LONG_OCTAL_CONSTANT:
    case KW_UNSIGNED_LONG_DECIMAL_CONSTANT:
    case KW_UNSIGNED_LONG_LONG_DECIMAL_CONSTANT:
    case KW_UNSIGNED_LONG_LONG_HEXADECIMAL_CONSTANT:
    case KW_UNSIGNED_LONG_LONG_OCTAL_CONSTANT:
    case KW_LONG_HEXADECIMAL_CONSTANT:
    case KW_LONG_OCTAL_CONSTANT:
    case KW_LONG_DECIMAL_CONSTANT:
    case KW_LONG_LONG_HEXADECIMAL_CONSTANT:
    case KW_LONG_LONG_OCTAL_CONSTANT:
    case KW_LONG_LONG_DECIMAL_CONSTANT:
    case KW_DOUBLE_DECIMAL_CONSTANT:
    case KW_LONG_DOUBLE_DECIMAL_CONSTANT:
    case KW_FLOAT_DECIMAL_CONSTANT:
    case KW_DOUBLE_HEXADECIMAL_CONSTANT:
    case KW_LONG_DOUBLE_HEXADECIMAL_CONSTANT:
    case KW_FLOAT_HEXADECIMAL_CONSTANT:
    case KW_CHAR_CONSTANT:
    case KW_WIDE_CHAR_CONSTANT:
      translation_data_local = (Translation_Data *)get_constant_tree(string);
      break;
    case KW_ID:
      translation_data_local = (Translation_Data *)get_lvalue_expression_tree(string,scope);
      break;
    case KW_STRING:
    case KW_WIDE_STRING:
      translation_data_local = (Translation_Data *)get_string_literal_tree(string);
    }
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_primary_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct token *hold_token;
	struct AST *hold;
	
	if(translation_data->tokens->size==0)
	{
		/*TODO error*/
		push_translation_error("expected something here",translation_data);
		return (struct AST*)get_error_tree(NULL);
	}
	hold_token=Queue_Pop(translation_data->tokens);
	switch(hold_token->type)
	{
		case KW_STRING:
		case KW_WIDE_STRING:
			return (struct AST*)get_string_literal_tree(hold_token);
		case KW_CHAR_CONSTANT:
		case KW_WIDE_CHAR_CONSTANT:
		case KW_HEXADECIMAL_CONSTANT:
		case KW_DECIMAL_CONSTANT:
		case KW_OCTAL_CONSTANT:
		case KW_UNSIGNED_DECIMAL_CONSTANT:
		case KW_UNSIGNED_OCTAL_CONSTANT:
		case KW_UNSIGNED_HEXADECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_HEXADECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_OCTAL_CONSTANT:
		case KW_UNSIGNED_LONG_DECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_LONG_DECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_LONG_HEXADECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_LONG_OCTAL_CONSTANT:
		case KW_LONG_HEXADECIMAL_CONSTANT:
		case KW_LONG_OCTAL_CONSTANT:
		case KW_LONG_DECIMAL_CONSTANT:
		case KW_LONG_LONG_HEXADECIMAL_CONSTANT:
		case KW_LONG_LONG_OCTAL_CONSTANT:
		case KW_LONG_LONG_DECIMAL_CONSTANT:
		case KW_DOUBLE_DECIMAL_CONSTANT:
		case KW_LONG_DOUBLE_DECIMAL_CONSTANT:
		case KW_FLOAT_DECIMAL_CONSTANT:
		case KW_DOUBLE_HEXADECIMAL_CONSTANT:
		case KW_LONG_DOUBLE_HEXADECIMAL_CONSTANT:
		case KW_FLOAT_HEXADECIMAL_CONSTANT:
			return (struct AST*)get_constant_tree(hold_token);

		case KW_ID:
			return (struct AST*)get_lvalue_expression_tree(hold_token,scope);
		case KW_OPEN_NORMAL:
			hold=parse_expression(translation_data,scope);
			if(get_and_check(translation_data,KW_CLOSE_NORMAL))
			{
				return (struct AST*)hold;
			}else
			{
				/*TODO error*/
				push_translation_error("expected ')' here",translation_data);
				return (struct AST*)get_error_tree(hold);
			}
		default:
			/*TODO error*/
			push_translation_error("error in expression",translation_data);
			return (struct AST*)get_error_tree(NULL);
	}

	/*just in case*/
	assert(0);
	return (struct AST*)get_error_tree(NULL);

}